

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_switch::translate
          (method_switch *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  element_type *peVar2;
  long *plVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Elt_pointer pdVar6;
  token_base *ptVar7;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar8;
  long *plVar9;
  ctrl_t *pcVar10;
  slot_type *psVar11;
  size_t sVar12;
  size_t sVar13;
  int iVar14;
  statement_base *psVar15;
  const_reference pptVar16;
  undefined4 extraout_var;
  compile_error *pcVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  long lVar18;
  ulong uVar19;
  _Elt_pointer pptVar20;
  long *plVar21;
  context_t *context_00;
  long lVar22;
  any *key;
  long *plVar23;
  const_iterator cVar24;
  _Self __tmp;
  map_t<var,_statement_block_*> cases;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  element_type *local_200;
  string local_1f8;
  context_t *local_1d8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_1d0;
  statement_block *local_1c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_1c0;
  context_t local_1a0;
  _Head_base<0UL,_cs::statement_block_*&&,_false> local_190 [9];
  undefined1 local_148 [120];
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 uStack_c0;
  long *local_b8;
  long lStack_b0;
  long *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  local_88;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = (long *)0x0;
  uStack_a0 = 0;
  local_b8 = (long *)0x0;
  lStack_b0 = 0;
  local_c8 = (long *)0x0;
  uStack_c0 = 0;
  local_148._112_8_ = 0;
  uStack_d0 = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (local_148 + 0x70),0);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c0._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_1c0._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_1c0._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1c0._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar22 = (long)local_1c0._M_cur - (long)local_1c0._M_first;
  lVar18 = lVar22 >> 4;
  uVar1 = lVar18 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    local_1c0._M_cur = local_1c0._M_cur + 1;
  }
  else {
    if (lVar22 < -0x4f) {
      uVar19 = ~((lVar18 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar19 = uVar1 / 6;
    }
    local_1c0._M_node = local_1c0._M_node + uVar19;
    local_1c0._M_first = *local_1c0._M_node;
    local_1c0._M_last = local_1c0._M_first + 6;
    local_1c0._M_cur = local_1c0._M_first + uVar19 * -6 + uVar1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_1d8 = context;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)local_148,&local_1c0,&local_58,(allocator_type *)&local_1f8);
  context_00 = &peVar2->context;
  local_1d0 = raw;
  translator_type::translate
            (&peVar2->translator,context_00,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (local_148 + 0x70),false);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)local_148);
  plVar9 = local_a8;
  local_148._0_8_ = phmap::priv::EmptyGroup()::empty_group;
  local_148._40_8_ =
       (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_0UL,_false>
        )0x0;
  local_148._8_8_ = (slot_type *)0x0;
  local_148._16_8_ = (_Elt_pointer)0x0;
  local_200 = (element_type *)0x0;
  local_148._24_8_ = (_Elt_pointer)0x0;
  if (local_c8 != local_a8) {
    local_200 = (element_type *)0x0;
    plVar21 = local_c8;
    plVar23 = local_b8;
    lVar18 = lStack_b0;
    do {
      iVar14 = (**(code **)(*(long *)*plVar21 + 0x10))();
      plVar3 = (long *)*plVar21;
      if (iVar14 == 0xd) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar3 + 4);
        cVar24 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                 ::find<cs_impl::any>
                           ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                             *)local_148,(key_arg<cs_impl::any> *)p_Var5);
        if (cVar24.inner_.ctrl_ != (ctrl_t *)(local_148._0_8_ + local_148._24_8_)) {
          pcVar17 = (compile_error *)__cxa_allocate_exception(0x28);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Redefinition of case.","");
          compile_error::compile_error(pcVar17,&local_1f8);
          __cxa_throw(pcVar17,&compile_error::typeinfo,compile_error::~compile_error);
        }
        local_1c8 = (statement_block *)plVar3[5];
        local_1a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_148;
        local_190[0]._M_head_impl = &local_1c8;
        context_00 = &local_1a0;
        local_1a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = p_Var5;
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
        ::EmplaceDecomposable::operator()
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
                    *)&local_1f8,context_00,(any *)p_Var5,
                   (piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<const_cs_impl::any_&> *)
                   &local_1a0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(tuple<cs::statement_block_*&&> *)local_190);
      }
      else {
        iVar14 = (**(code **)(*plVar3 + 0x10))(plVar3);
        if (iVar14 != 0xe) {
          pcVar17 = (compile_error *)__cxa_allocate_exception(0x28);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Unexpected statement in switch definition.","");
          compile_error::compile_error(pcVar17,&local_1f8);
          __cxa_throw(pcVar17,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (local_200 != (element_type *)0x0) {
          pcVar17 = (compile_error *)__cxa_allocate_exception(0x28);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Redefinition of default case.","");
          compile_error::compile_error(pcVar17,&local_1f8);
          __cxa_throw(pcVar17,&compile_error::typeinfo,compile_error::~compile_error);
        }
        local_200 = *(element_type **)(*plVar21 + 0x20);
      }
      plVar21 = plVar21 + 1;
      if (plVar21 == plVar23) {
        plVar21 = *(long **)(lVar18 + 8);
        lVar18 = lVar18 + 8;
        plVar23 = plVar21 + 0x40;
      }
    } while (plVar21 != plVar9);
  }
  psVar15 = (statement_base *)
            statement_base::operator_new((statement_base *)0x60,(size_t)context_00);
  pdVar8 = local_1d0;
  pptVar16 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((local_1d0->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  iVar14 = tree_type<cs::token_base_*>::copy
                     ((EVP_PKEY_CTX *)(*pptVar16)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  ::raw_hash_set(&local_88,
                 (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                  *)local_148,(allocator_type *)&local_1f8);
  sVar13 = local_88.capacity_;
  sVar12 = local_88.size_;
  psVar11 = local_88.slots_;
  pcVar10 = local_88.ctrl_;
  peVar4 = (local_1d8->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (local_1d8->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  pdVar6 = (pdVar8->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar20 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar20 ==
      (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar20 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar7 = pptVar20[-1];
  psVar15->_vptr_statement_base = (_func_int **)&PTR__statement_base_0025e3f0;
  (psVar15->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (psVar15->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  psVar15->line_num = ptVar7->line_num;
  psVar15->_vptr_statement_base = (_func_int **)&PTR__statement_switch_0025f350;
  psVar15[1]._vptr_statement_base = (_func_int **)CONCAT44(extraout_var,iVar14);
  psVar15[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_200;
  local_88.ctrl_ = phmap::priv::EmptyGroup()::empty_group;
  local_88.slots_ = (slot_type *)0x0;
  psVar15[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar10;
  psVar15[1].line_num = (size_t)psVar11;
  local_88.size_ = 0;
  local_88.capacity_ = 0;
  psVar15[2]._vptr_statement_base = (_func_int **)sVar12;
  psVar15[2].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sVar13;
  psVar15[2].line_num =
       (size_t)local_88.settings_.
               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
               .
               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_0UL,_false>
               .value;
  local_88.settings_.
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_0UL,_false>
  .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_0UL,_false>
              )0x0;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  ::destroy_slots(&local_88);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                   *)local_148);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (local_148 + 0x70));
  return psVar15;
}

Assistant:

statement_base *
	method_switch::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		statement_block *dptr = nullptr;
		map_t<var, statement_block *> cases;
		for (auto &it: body) {
			try {
				if (it->get_type() == statement_types::case_) {
					auto *scptr = static_cast<statement_case *>(it);
					if (cases.count(scptr->get_tag()) > 0)
						throw compile_error("Redefinition of case.");
					cases.emplace(scptr->get_tag(), scptr->get_block());
				}
				else if (it->get_type() == statement_types::default_) {
					auto *sdptr = static_cast<statement_default *>(it);
					if (dptr != nullptr)
						throw compile_error("Redefinition of default case.");
					dptr = sdptr->get_block();
				}
				else
					throw compile_error("Unexpected statement in switch definition.");
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(it->get_line_num(), it->get_file_path(), it->get_raw_code(), e.what());
			}
		}
		return new statement_switch(static_cast<token_expr *>(raw.front().at(1))->get_tree(), cases, dptr, context,
		                            raw.front().back());
	}